

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O0

void bignum_to_string(bn *n,char *str,int nbytes)

{
  long lVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int j;
  int local_24;
  int local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    __assert_fail("n && \"\\\"n is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x7e,"void bignum_to_string(struct bn *, char *, int)");
  }
  if (in_RSI == 0) {
    __assert_fail("str && \"\\\"str is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x7f,"void bignum_to_string(struct bn *, char *, int)");
  }
  if ((int)in_EDX < 1) {
    __assert_fail("nbytes > 0 && \"\\\"nbytes must be positive\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x80,"void bignum_to_string(struct bn *, char *, int)");
  }
  if ((in_EDX & 1) != 0) {
    __assert_fail("(nbytes & 1) == 0 && \"\\\"string format must be in hex -> equal number of bytes\\\"\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x81,"void bignum_to_string(struct bn *, char *, int)");
  }
  local_24 = 0;
  for (local_20 = 0x1f; -1 < local_20 && local_24 + 1 < (int)in_EDX; local_20 = local_20 + -1) {
    sprintf((char *)(in_RSI + local_24),"%.08x",(ulong)*(uint *)(in_RDI + (long)local_20 * 4));
    local_24 = local_24 + 8;
  }
  for (local_20 = 0; *(char *)(in_RSI + local_20) == '0'; local_20 = local_20 + 1) {
  }
  for (local_24 = 0; local_24 < (int)(in_EDX - local_20); local_24 = local_24 + 1) {
    *(undefined1 *)(in_RSI + local_24) = *(undefined1 *)(in_RSI + (local_24 + local_20));
  }
  *(undefined1 *)(in_RSI + local_24) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void bignum_to_string(struct bn* n, char* str, int nbytes)
{
  require(n, "n is null");
  require(str, "str is null");
  require(nbytes > 0, "nbytes must be positive");
  require((nbytes & 1) == 0, "string format must be in hex -> equal number of bytes");

  int j = BN_ARRAY_SIZE - 1; /* index into array - reading "MSB" first -> big-endian */
  int i = 0;                 /* index into string representation. */

  /* reading last array-element "MSB" first -> big endian */
  while ((j >= 0) && (nbytes > (i + 1)))
  {
    sprintf(&str[i], SPRINTF_FORMAT_STR, n->array[j]);
    i += (2 * WORD_SIZE); /* step WORD_SIZE hex-byte(s) forward in the string. */
    j -= 1;               /* step one element back in the array. */
  }

  /* Count leading zeros: */
  j = 0;
  while (str[j] == '0')
  {
    j += 1;
  }
 
  /* Move string j places ahead, effectively skipping leading zeros */ 
  for (i = 0; i < (nbytes - j); ++i)
  {
    str[i] = str[i + j];
  }

  /* Zero-terminate string */
  str[i] = 0;
}